

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2.cpp
# Opt level: O3

void amrex::EB2::Build(Geometry *geom,int required_coarsening_level,int max_coarsening_level,
                      int ngrow,bool build_coarse_level_by_coarsening,bool a_extend_domain_face,
                      int a_num_coarsen_opt)

{
  pointer *ppdVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  long *plVar4;
  IndexSpaceSTL *this;
  size_type *psVar5;
  long lVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  uint uVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<double> __l_00;
  bool has_fluid_inside_1;
  int stl_reverse_normal;
  ulong local_168;
  ulong local_160;
  vector<double,_std::allocator<double>_> stl_center;
  Real stl_scale;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  Real small_radius;
  pointer pbStack_120;
  pointer local_118;
  string geom_type;
  string stl_file;
  pointer local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  long *local_a8 [2];
  long local_98 [2];
  ParmParse pp;
  
  paVar2 = &stl_file.field_2;
  stl_file._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stl_file,"eb2","");
  ParmParse::ParmParse(&pp,&stl_file);
  local_168 = (ulong)(uint)ngrow;
  local_160 = (ulong)(uint)max_coarsening_level;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)stl_file._M_dataplus._M_p != paVar2) {
    operator_delete(stl_file._M_dataplus._M_p,stl_file.field_2._M_allocated_capacity + 1);
  }
  geom_type._M_dataplus._M_p = (pointer)&geom_type.field_2;
  geom_type._M_string_length = 0;
  geom_type.field_2._M_local_buf[0] = '\0';
  ParmParse::get(&pp,"geom_type",&geom_type,0);
  iVar3 = std::__cxx11::string::compare((char *)&geom_type);
  if (iVar3 == 0) {
    stl_file._M_dataplus._M_p = stl_file._M_dataplus._M_p & 0xffffffff;
    Build<amrex::EB2::GeometryShop<amrex::EB2::AllRegularIF,int>>
              ((GeometryShop<amrex::EB2::AllRegularIF,_int> *)&stl_file,geom,
               required_coarsening_level,(int)local_160,(int)local_168,
               build_coarse_level_by_coarsening,a_extend_domain_face,a_num_coarsen_opt);
    goto LAB_005ecd9a;
  }
  iVar3 = std::__cxx11::string::compare((char *)&geom_type);
  if (iVar3 == 0) {
    ParmParse::get<double,3ul>(&pp,"box_lo",(array<double,_3UL> *)&stl_center);
    ParmParse::get<double,3ul>(&pp,"box_hi",(array<double,_3UL> *)&small_radius);
    ParmParse::get(&pp,"box_has_fluid_inside",(bool *)&stl_scale,0);
    stl_file.field_2._M_allocated_capacity =
         CONCAT71(stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._1_7_,
                  stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._0_1_);
    if (stl_scale._0_1_ == '\0') {
      uVar9 = 0xbff00000;
    }
    else {
      uVar9 = 0x3ff00000;
    }
    stl_file._M_dataplus._M_p =
         (pointer)stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    stl_file._M_string_length =
         (size_type)
         stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    stl_file.field_2._8_8_ = small_radius;
    local_c8 = pbStack_120;
    local_c0 = local_118;
    local_b8._0_8_ = (ulong)uVar9 << 0x20;
    local_b8._8_4_ = 0;
    Build<amrex::EB2::GeometryShop<amrex::EB2::BoxIF,int>>
              ((GeometryShop<amrex::EB2::BoxIF,_int> *)&stl_file,geom,required_coarsening_level,
               (int)local_160,(int)local_168,build_coarse_level_by_coarsening,a_extend_domain_face,
               a_num_coarsen_opt);
    goto LAB_005ecd9a;
  }
  iVar3 = std::__cxx11::string::compare((char *)&geom_type);
  if (iVar3 == 0) {
    ParmParse::get<double,3ul>(&pp,"cylinder_center",(array<double,_3UL> *)&stl_center);
    ParmParse::get(&pp,"cylinder_radius",&small_radius,0);
    stl_scale = -1.0;
    ParmParse::queryAdd<double,_0>(&pp,"cylinder_height",&stl_scale);
    ParmParse::get(&pp,"cylinder_direction",&stl_reverse_normal,0);
    if (2 < (uint)stl_reverse_normal) {
      Assert_host("direction >=0 && direction < 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2.cpp"
                  ,0x83,"\"eb2.cylinder_direction is invalid\"");
    }
    ParmParse::get(&pp,"cylinder_has_fluid_inside",&has_fluid_inside_1,0);
    local_c0 = (pointer)CONCAT71(stl_center.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                 stl_center.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
    if (has_fluid_inside_1 == false) {
      uVar9 = 0xbff00000;
    }
    else {
      uVar9 = 0x3ff00000;
    }
    stl_file._M_dataplus._M_p = (pointer)small_radius;
    stl_file._M_string_length = (size_type)stl_scale;
    stl_file.field_2._M_allocated_capacity._0_4_ = stl_reverse_normal;
    stl_file.field_2._8_8_ =
         stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_c8 = (pointer)stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    local_b8._0_8_ = (ulong)uVar9 << 0x20;
    local_b8._8_4_ = 0;
    Build<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>
              ((GeometryShop<amrex::EB2::CylinderIF,_int> *)&stl_file,geom,required_coarsening_level
               ,(int)local_160,(int)local_168,build_coarse_level_by_coarsening,a_extend_domain_face,
               a_num_coarsen_opt);
    goto LAB_005ecd9a;
  }
  iVar3 = std::__cxx11::string::compare((char *)&geom_type);
  if (iVar3 == 0) {
    ParmParse::get<double,3ul>(&pp,"plane_point",(array<double,_3UL> *)&stl_center);
    ParmParse::get<double,3ul>(&pp,"plane_normal",(array<double,_3UL> *)&small_radius);
    stl_file.field_2._M_allocated_capacity =
         CONCAT71(stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._1_7_,
                  stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._0_1_);
    stl_file._M_dataplus._M_p =
         (pointer)stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    stl_file._M_string_length =
         (size_type)
         stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    stl_file.field_2._8_8_ = small_radius;
    local_c8 = pbStack_120;
    local_c0 = local_118;
    local_b8._0_8_ = 1.0;
    local_b8._8_4_ = 0;
    Build<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,int>>
              ((GeometryShop<amrex::EB2::PlaneIF,_int> *)&stl_file,geom,required_coarsening_level,
               (int)local_160,(int)local_168,build_coarse_level_by_coarsening,a_extend_domain_face,
               a_num_coarsen_opt);
    goto LAB_005ecd9a;
  }
  iVar3 = std::__cxx11::string::compare((char *)&geom_type);
  if (iVar3 == 0) {
    ParmParse::get<double,3ul>(&pp,"sphere_center",(array<double,_3UL> *)&stl_center);
    ParmParse::get(&pp,"sphere_radius",&small_radius,0);
    ParmParse::get(&pp,"sphere_has_fluid_inside",(bool *)&stl_scale,0);
    stl_file.field_2._8_8_ =
         CONCAT71(stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._1_7_,
                  stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._0_1_);
    if (stl_scale._0_1_ == '\0') {
      uVar9 = 0xbff00000;
    }
    else {
      uVar9 = 0x3ff00000;
    }
    stl_file._M_dataplus._M_p = (pointer)small_radius;
    stl_file._M_string_length =
         (size_type)
         stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    stl_file.field_2._M_allocated_capacity =
         (size_type)
         stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_c8 = (pointer)((ulong)uVar9 << 0x20);
    local_c0 = (pointer)((ulong)local_c0._4_4_ << 0x20);
    Build<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>
              ((GeometryShop<amrex::EB2::SphereIF,_int> *)&stl_file,geom,required_coarsening_level,
               (int)local_160,(int)local_168,build_coarse_level_by_coarsening,a_extend_domain_face,
               a_num_coarsen_opt);
    goto LAB_005ecd9a;
  }
  iVar3 = std::__cxx11::string::compare((char *)&geom_type);
  if (iVar3 == 0) {
    ParmParse::get<double,3ul>(&pp,"torus_center",(array<double,_3UL> *)&stl_center);
    ParmParse::get(&pp,"torus_small_radius",&small_radius,0);
    ParmParse::get(&pp,"torus_large_radius",&stl_scale,0);
    local_c8 = (pointer)CONCAT71(stl_center.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                 stl_center.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
    stl_file._M_dataplus._M_p = (pointer)stl_scale;
    stl_file._M_string_length = (size_type)small_radius;
    stl_file.field_2._M_allocated_capacity =
         (size_type)
         stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    stl_file.field_2._8_8_ =
         stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_b8._0_8_ = 1.0;
    local_b8._8_4_ = 0;
    Build<amrex::EB2::GeometryShop<amrex::EB2::TorusIF,int>>
              ((GeometryShop<amrex::EB2::TorusIF,_int> *)&stl_file,geom,required_coarsening_level,
               (int)local_160,(int)local_168,build_coarse_level_by_coarsening,a_extend_domain_face,
               a_num_coarsen_opt);
    goto LAB_005ecd9a;
  }
  iVar3 = std::__cxx11::string::compare((char *)&geom_type);
  if (iVar3 == 0) {
    ppdVar1 = &stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_1_ = 0;
    stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)ppdVar1;
    ParmParse::get(&pp,"parser_function",(string *)&stl_center,0);
    Parser::Parser((Parser *)&stl_scale,(string *)&stl_center);
    stl_file._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&stl_file,"x","");
    local_c8 = (pointer)local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"y","");
    plVar4 = local_98;
    local_a8[0] = plVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"z","");
    __l._M_len = 3;
    __l._M_array = &stl_file;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&small_radius,__l,(allocator_type *)&stl_reverse_normal);
    Parser::registerVariables
              ((Parser *)&stl_scale,
               (Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&small_radius);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&small_radius);
    lVar6 = -0x60;
    do {
      if (plVar4 != (long *)plVar4[-2]) {
        operator_delete((long *)plVar4[-2],*plVar4 + 1);
      }
      plVar4 = plVar4 + -4;
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0);
    stl_file._M_dataplus._M_p = (pointer)Parser::compileHost<3>((Parser *)&stl_scale);
    stl_file._M_string_length = (size_type)stl_scale;
    stl_file.field_2._M_allocated_capacity = (size_type)local_130._M_pi;
    if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_130._M_pi)->_M_use_count = (local_130._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_130._M_pi)->_M_use_count = (local_130._M_pi)->_M_use_count + 1;
      }
    }
    Build<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>
              ((GeometryShop<amrex::EB2::ParserIF,_amrex::Parser> *)&stl_file,geom,
               required_coarsening_level,(int)local_160,(int)local_168,
               build_coarse_level_by_coarsening,a_extend_domain_face,a_num_coarsen_opt);
    Parser::~Parser((Parser *)&stl_file._M_string_length);
    Parser::~Parser((Parser *)&stl_scale);
    if ((pointer *)
        stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start == ppdVar1) goto LAB_005ecd9a;
LAB_005ecd8d:
    uVar7 = CONCAT71(stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._1_7_,
                     stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._0_1_);
    _Var8._M_p = (pointer)stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&geom_type);
    if (iVar3 != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stl_center,"geom_type ",&geom_type);
      plVar4 = (long *)std::__cxx11::string::append((char *)&stl_center);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar5) {
        stl_file.field_2._M_allocated_capacity = *psVar5;
        stl_file.field_2._8_8_ = plVar4[3];
        stl_file._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        stl_file.field_2._M_allocated_capacity = *psVar5;
        stl_file._M_dataplus._M_p = (pointer)*plVar4;
      }
      stl_file._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      Abort(&stl_file);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)stl_file._M_dataplus._M_p != paVar2) {
        operator_delete(stl_file._M_dataplus._M_p,stl_file.field_2._M_allocated_capacity + 1);
      }
      if ((pointer *)
          stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start ==
          &stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) goto LAB_005ecd9a;
      goto LAB_005ecd8d;
    }
    stl_file._M_string_length = 0;
    stl_file.field_2._M_allocated_capacity =
         stl_file.field_2._M_allocated_capacity & 0xffffffffffffff00;
    stl_file._M_dataplus._M_p = (pointer)paVar2;
    ParmParse::get(&pp,"stl_file",&stl_file,0);
    stl_scale = 1.0;
    ParmParse::queryAdd<double,_0>(&pp,"stl_scale",&stl_scale);
    small_radius = 0.0;
    pbStack_120 = (pointer)0x0;
    local_118 = (pointer)0x0;
    __l_00._M_len = 3;
    __l_00._M_array = &small_radius;
    std::vector<double,_std::allocator<double>_>::vector
              (&stl_center,__l_00,(allocator_type *)&stl_reverse_normal);
    ParmParse::queryAdd<double>(&pp,"stl_center",&stl_center);
    stl_reverse_normal = 0;
    ParmParse::queryAdd<int,_0>(&pp,"stl_reverse_normal",&stl_reverse_normal);
    this = (IndexSpaceSTL *)operator_new(0x68);
    small_radius = *stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
    pbStack_120 = (pointer)stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[1];
    local_118 = (pointer)stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[2];
    IndexSpaceSTL::IndexSpaceSTL
              (this,&stl_file,stl_scale,(Array<Real,_3> *)&small_radius,stl_reverse_normal,geom,
               required_coarsening_level,(int)local_160,(int)local_168,
               build_coarse_level_by_coarsening,a_extend_domain_face,a_num_coarsen_opt);
    IndexSpace::push((IndexSpace *)0x5ecca4);
    if (stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      CONCAT71(stl_center.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                               stl_center.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                      (long)stl_center.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar7 = stl_file.field_2._M_allocated_capacity;
    _Var8._M_p = stl_file._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)stl_file._M_dataplus._M_p == paVar2) goto LAB_005ecd9a;
  }
  operator_delete(_Var8._M_p,uVar7 + 1);
LAB_005ecd9a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)geom_type._M_dataplus._M_p != &geom_type.field_2) {
    operator_delete(geom_type._M_dataplus._M_p,
                    CONCAT71(geom_type.field_2._M_allocated_capacity._1_7_,
                             geom_type.field_2._M_local_buf[0]) + 1);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&pp);
  return;
}

Assistant:

void
Build (const Geometry& geom, int required_coarsening_level,
       int max_coarsening_level, int ngrow, bool build_coarse_level_by_coarsening,
       bool a_extend_domain_face, int a_num_coarsen_opt)
{
    ParmParse pp("eb2");
    std::string geom_type;
    pp.get("geom_type", geom_type);

    if (geom_type == "all_regular")
    {
        EB2::AllRegularIF rif;
        EB2::GeometryShop<EB2::AllRegularIF> gshop(rif);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "box")
    {
        RealArray lo;
        pp.get("box_lo", lo);

        RealArray hi;
        pp.get("box_hi", hi);

        bool has_fluid_inside;
        pp.get("box_has_fluid_inside", has_fluid_inside);

        EB2::BoxIF bf(lo, hi, has_fluid_inside);

        EB2::GeometryShop<EB2::BoxIF> gshop(bf);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "cylinder")
    {
        RealArray center;
        pp.get("cylinder_center", center);

        Real radius;
        pp.get("cylinder_radius", radius);

        Real height = -1.0;
        pp.queryAdd("cylinder_height", height);

        int direction;
        pp.get("cylinder_direction", direction);
        AMREX_ALWAYS_ASSERT_WITH_MESSAGE(direction >=0 && direction < 3,
                                         "eb2.cylinder_direction is invalid");

        bool has_fluid_inside;
        pp.get("cylinder_has_fluid_inside", has_fluid_inside);

        EB2::CylinderIF cf(radius, height, direction, center, has_fluid_inside);

        EB2::GeometryShop<EB2::CylinderIF> gshop(cf);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "plane")
    {
        RealArray point;
        pp.get("plane_point", point);

        RealArray normal;
        pp.get("plane_normal", normal);

        EB2::PlaneIF pf(point, normal);

        EB2::GeometryShop<EB2::PlaneIF> gshop(pf);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "sphere")
    {
        RealArray center;
        pp.get("sphere_center", center);

        Real radius;
        pp.get("sphere_radius", radius);

        bool has_fluid_inside;
        pp.get("sphere_has_fluid_inside", has_fluid_inside);

        EB2::SphereIF sf(radius, center, has_fluid_inside);

        EB2::GeometryShop<EB2::SphereIF> gshop(sf);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "torus")
    {
        RealArray center;
        pp.get("torus_center", center);

        Real small_radius;
        pp.get("torus_small_radius", small_radius);

        Real large_radius;
        pp.get("torus_large_radius", large_radius);

        bool has_fluid_inside = true;

        EB2::TorusIF sf(large_radius, small_radius, center, has_fluid_inside);

        EB2::GeometryShop<EB2::TorusIF> gshop(sf);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "parser")
    {
        std::string fn_string;
        pp.get("parser_function", fn_string);
        Parser parser(fn_string);
        parser.registerVariables({"x","y","z"});
        EB2::ParserIF pif(parser.compile<3>());
        EB2::GeometryShop<EB2::ParserIF,Parser> gshop(pif,parser);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "stl")
    {
        std::string stl_file;
        pp.get("stl_file", stl_file);
        Real stl_scale = 1._rt;
        pp.queryAdd("stl_scale", stl_scale);
        std::vector<Real> stl_center{0.0_rt, 0.0_rt, 0.0_rt};
        pp.queryAdd("stl_center", stl_center);
        int stl_reverse_normal = 0;
        pp.queryAdd("stl_reverse_normal", stl_reverse_normal);
        IndexSpace::push(new IndexSpaceSTL(stl_file, stl_scale,
                                           {stl_center[0], stl_center[1], stl_center[2]},
                                           stl_reverse_normal,
                                           geom, required_coarsening_level,
                                           max_coarsening_level, ngrow,
                                           build_coarse_level_by_coarsening,
                                           a_extend_domain_face,
                                           a_num_coarsen_opt));
    }
    else
    {
        amrex::Abort("geom_type "+geom_type+ " not supported");
    }
}